

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_inflateEnd(lzham_z_streamp pStream)

{
  uint32 uVar1;
  long in_RDI;
  lzham_decompress_state_ptr pState;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI == 0) {
    iVar2 = -2;
  }
  else {
    if (*(long *)(in_RDI + 0x38) != 0) {
      uVar1 = lzham_lib_decompress_deinit
                        ((lzham_decompress_state_ptr)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      *(ulong *)(in_RDI + 0x60) = (ulong)uVar1;
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateEnd(lzham_z_streamp pStream)
   {
      if (!pStream)
         return LZHAM_Z_STREAM_ERROR;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      if (pState)
      {
         pStream->adler = lzham_lib_decompress_deinit(pState);
         pStream->state = NULL;
      }

      return LZHAM_Z_OK;
   }